

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

size_t testing::internal::GetThreadCount(void)

{
  long lVar1;
  __pid_t _Var2;
  ostream *this;
  size_t sVar3;
  int iVar4;
  long in_FS_OFFSET;
  int local_26c;
  string filename;
  ifstream file;
  string dummy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Message::Message((Message *)&file);
  this = (ostream *)(_file + 0x10);
  std::operator<<(this,"/proc/");
  _Var2 = getpid();
  std::ostream::operator<<(this,_Var2);
  std::operator<<((ostream *)(_file + 0x10),"/stat");
  StringStreamToString(&filename,_file);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&file);
  dummy._M_dataplus._M_p = (pointer)&dummy.field_2;
  dummy._M_string_length = 0;
  dummy.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&file,filename._M_dataplus._M_p,_S_in);
  iVar4 = -0x14;
  while (iVar4 = iVar4 + 1, iVar4 != 0) {
    std::operator>>((istream *)&file,(string *)&dummy);
  }
  local_26c = 0;
  std::istream::operator>>((istream *)&file,&local_26c);
  sVar3 = (size_t)local_26c;
  std::ifstream::~ifstream(&file);
  std::__cxx11::string::~string((string *)&dummy);
  std::__cxx11::string::~string((string *)&filename);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar3;
  }
  __stack_chk_fail();
}

Assistant:

size_t GetThreadCount() {
  const std::string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<int>(filename, 19);
}